

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wif.c
# Opt level: O3

int wally_wif_to_bytes(char *wif,uint32_t prefix,uint32_t flags,uchar *bytes_out,size_t len)

{
  int iVar1;
  int iVar2;
  size_t uncompressed;
  uchar buf [38];
  long local_50;
  byte local_48;
  undefined8 local_47;
  undefined8 uStack_3f;
  undefined8 local_37;
  undefined8 uStack_2f;
  
  iVar2 = -2;
  if ((flags < 2 && wif != (char *)0x0) &&
     (len == 0x20 && (bytes_out != (uchar *)0x0 && 0xff >= prefix))) {
    iVar1 = is_uncompressed(wif,&local_48,(size_t)&local_50,
                            (size_t *)
                            CONCAT71((int7)((ulong)bytes_out >> 8),
                                     bytes_out == (uchar *)0x0 || 0xff < prefix));
    iVar2 = -2;
    if ((iVar1 == 0) &&
       (((local_48 == prefix && (flags == 1 || local_50 == 0)) && (flags == 0 || local_50 != 0)))) {
      *(undefined8 *)(bytes_out + 0x10) = local_37;
      *(undefined8 *)(bytes_out + 0x18) = uStack_2f;
      *(undefined8 *)bytes_out = local_47;
      *(undefined8 *)(bytes_out + 8) = uStack_3f;
      iVar2 = 0;
    }
    wally_clear(&local_48,0x26);
  }
  return iVar2;
}

Assistant:

int wally_wif_to_bytes(const char *wif,
                       uint32_t prefix,
                       uint32_t flags,
                       unsigned char *bytes_out,
                       size_t len)
{
    int ret;
    unsigned char buf[2 + EC_PRIVATE_KEY_LEN + BASE58_CHECKSUM_LEN];
    size_t uncompressed;

    if (!wif || (flags & ~WIF_ALL_DEFINED_FLAGS) || (prefix & ~0xff) ||
        !bytes_out || len != EC_PRIVATE_KEY_LEN)
        return WALLY_EINVAL;

    ret = is_uncompressed(wif, buf, sizeof(buf), &uncompressed);

    if (ret != WALLY_OK ||
        (buf[0] != prefix) ||
        (uncompressed && flags != WALLY_WIF_FLAG_UNCOMPRESSED) ||
        (!uncompressed && flags != WALLY_WIF_FLAG_COMPRESSED)) {
        wally_clear(buf, sizeof(buf));
        return WALLY_EINVAL; /** Incorrect format, prefix does not match or inconsistent flag */
    }

    memcpy(bytes_out, &buf[1], EC_PRIVATE_KEY_LEN);

    wally_clear(buf, sizeof(buf));
    return WALLY_OK;
}